

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_local_time_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          local_time_type *t,bool has_seconds,size_t subsec_prec)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string subsec_str;
  ostringstream subsec;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  long *local_358 [2];
  long local_348 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  ostringstream local_318;
  undefined7 uStack_317;
  undefined8 auStack_308 [12];
  ios_base local_2a8 [112];
  char acStack_238 [152];
  long local_1a0 [2];
  undefined8 auStack_190 [12];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + -0x28);
    acStack_c0[lVar1] = cVar2;
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = '0';
  *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
  std::ostream::operator<<(local_1a0,(uint)t->hour);
  local_318 = (ostringstream)0x3a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_318,1);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + -0x28);
    acStack_c0[lVar1] = cVar2;
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = '0';
  *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
  std::ostream::operator<<(local_1a0,(uint)t->minute);
  if (has_seconds) {
    local_318 = (ostringstream)0x3a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_318,1);
    lVar1 = *(long *)(local_1a0[0] + -0x18);
    if (acStack_c0[lVar1 + 1] == '\0') {
      cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + -0x28);
      acStack_c0[lVar1] = cVar2;
      acStack_c0[lVar1 + 1] = '\x01';
    }
    acStack_c0[lVar1] = '0';
    *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
    std::ostream::operator<<(local_1a0,(uint)t->second);
    if (subsec_prec != 0) {
      std::__cxx11::ostringstream::ostringstream(&local_318);
      lVar1 = *(long *)(CONCAT71(uStack_317,local_318) + -0x18);
      if (acStack_238[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + '`');
        acStack_238[lVar1] = cVar2;
        acStack_238[lVar1 + 1] = '\x01';
      }
      acStack_238[lVar1] = '0';
      *(undefined8 *)((long)auStack_308 + *(long *)(CONCAT71(uStack_317,local_318) + -0x18)) = 3;
      std::ostream::operator<<(&local_318,(uint)t->millisecond);
      lVar1 = *(long *)(CONCAT71(uStack_317,local_318) + -0x18);
      if (acStack_238[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + '`');
        acStack_238[lVar1] = cVar2;
        acStack_238[lVar1 + 1] = '\x01';
      }
      acStack_238[lVar1] = '0';
      *(undefined8 *)((long)auStack_308 + *(long *)(CONCAT71(uStack_317,local_318) + -0x18)) = 3;
      std::ostream::operator<<(&local_318,(uint)t->microsecond);
      lVar1 = *(long *)(CONCAT71(uStack_317,local_318) + -0x18);
      if (acStack_238[lVar1 + 1] == '\0') {
        cVar2 = std::ios::widen((char)&local_378 + (char)lVar1 + '`');
        acStack_238[lVar1] = cVar2;
        acStack_238[lVar1 + 1] = '\x01';
      }
      acStack_238[lVar1] = '0';
      *(undefined8 *)((long)auStack_308 + *(long *)(CONCAT71(uStack_317,local_318) + -0x18)) = 3;
      std::ostream::operator<<(&local_318,(uint)t->nanosecond);
      std::__cxx11::stringbuf::str();
      local_378._M_dataplus._M_p._0_1_ = 0x2e;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(char *)&local_378,1);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_378,&local_338,0,subsec_prec);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)CONCAT71(local_378._M_dataplus._M_p._1_7_,
                                         local_378._M_dataplus._M_p._0_1_),
                 local_378._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_378._M_dataplus._M_p._1_7_,local_378._M_dataplus._M_p._0_1_) !=
          &local_378.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_378._M_dataplus._M_p._1_7_,local_378._M_dataplus._M_p._0_1_),
                        local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(&local_318);
      std::ios_base::~ios_base(local_2a8);
    }
  }
  std::__cxx11::stringbuf::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,(detail *)local_358,s);
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string_type format_local_time(const local_time_type& t, const bool has_seconds, const std::size_t subsec_prec) // {{{
    {
        std::ostringstream oss;
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.hour);
        oss << ':';
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.minute);
        if(has_seconds)
        {
            oss << ':';
            oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.second);
            if(subsec_prec != 0)
            {
                std::ostringstream subsec;
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.millisecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.microsecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.nanosecond);
                std::string subsec_str = subsec.str();
                oss << '.' << subsec_str.substr(0, subsec_prec);
            }
        }
        return string_conv<string_type>(oss.str());
    }